

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o_init.c
# Opt level: O2

int dodiscovered(void)

{
  nh_menuitem *pnVar1;
  char let;
  short sVar2;
  char cVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  char *__dest;
  int iVar10;
  int iVar11;
  menulist menu;
  char classes [18];
  char buf [256];
  
  init_menulist(&menu);
  lVar7 = (long)menu.size;
  if (menu.size <= menu.icount) {
    menu.size = menu.size * 2;
    menu.items = (nh_menuitem *)realloc(menu.items,lVar7 * 0x218);
  }
  lVar7 = (long)menu.icount;
  menu.items[lVar7].id = 0;
  menu.items[lVar7].role = MI_TEXT;
  menu.items[lVar7].accel = '\0';
  menu.items[lVar7].group_accel = '\0';
  menu.items[lVar7].selected = '\0';
  builtin_strncpy(menu.items[lVar7].caption,"Discover",8);
  builtin_strncpy(menu.items[lVar7].caption + 8,"ies",4);
  menu.icount = menu.icount + 1;
  lVar7 = (long)menu.size;
  if (menu.size <= menu.icount) {
    menu.size = menu.size * 2;
    menu.items = (nh_menuitem *)realloc(menu.items,lVar7 * 0x218);
  }
  lVar7 = (long)menu.icount;
  menu.items[lVar7].accel = '\0';
  menu.items[lVar7].group_accel = '\0';
  menu.items[lVar7].selected = '\0';
  menu.items[lVar7].id = 0;
  menu.items[lVar7].role = MI_TEXT;
  menu.items[lVar7].caption[0] = '\0';
  iVar6 = menu.icount + 1;
  iVar10 = 0;
  iVar11 = 0;
  menu.icount = iVar6;
  for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 2) {
    sVar2 = *(short *)((long)uniq_objs + lVar7);
    if ((objects[sVar2].field_0x10 & 1) != 0) {
      if (iVar11 == 0) {
        lVar8 = (long)menu.size;
        if (menu.size <= iVar6) {
          menu.size = menu.size * 2;
          menu.items = (nh_menuitem *)realloc(menu.items,lVar8 * 0x218);
          iVar6 = menu.icount;
        }
        menu.items[iVar6].id = 0;
        menu.items[iVar6].role = MI_HEADING;
        menu.items[iVar6].accel = '\0';
        menu.items[iVar6].group_accel = '\0';
        menu.items[iVar6].selected = '\0';
        builtin_strncpy(menu.items[iVar6].caption,"Unique I",8);
        builtin_strncpy(menu.items[iVar6].caption + 5,"e Items",8);
        menu.icount = menu.icount + 1;
      }
      sprintf(buf,"  %s",obj_descr[objects[sVar2].oc_name_idx].oc_name);
      lVar8 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar8 * 0x218);
      }
      iVar11 = iVar11 + 1;
      pnVar1 = menu.items + menu.icount;
      pnVar1->id = 0;
      pnVar1->role = MI_TEXT;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,buf);
      iVar6 = menu.icount + 1;
      iVar10 = iVar10 + 1;
      menu.icount = iVar6;
    }
  }
  iVar6 = disp_artifact_discoveries(&menu);
  __dest = classes;
  strcpy(__dest,flags.inv_order);
  pcVar4 = strchr(__dest,0x11);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = eos(classes);
    pcVar4[0] = '\x11';
    pcVar4[1] = '\0';
  }
  iVar6 = iVar6 + iVar10;
  do {
    let = *__dest;
    if ((long)let == 0) {
      if (iVar6 == 0) {
        pline("You haven\'t discovered anything yet...");
      }
      else {
        display_menu(menu.items,menu.icount,(char *)0x0,0,(int *)0x0);
      }
      free(menu.items);
      return 0;
    }
    cVar3 = let + '\x01';
    lVar7 = (long)bases[let];
    for (lVar8 = lVar7 * 0x14; (lVar7 < 0x21a && ((&objects->oc_class)[lVar8 * 2] == let));
        lVar8 = lVar8 + 0x14) {
      iVar10 = (int)disco[lVar7];
      if (disco[lVar7] != 0) {
        if (objects[iVar10].oc_uname == (char *)0x0) {
          if ((objects[iVar10].field_0x10 & 1) != 0) {
            if (obj_descr[objects[iVar10].oc_descr_idx].oc_descr != (char *)0x0) goto LAB_001fd459;
          }
        }
        else {
LAB_001fd459:
          if (let != cVar3) {
            lVar9 = (long)menu.size;
            if (menu.size <= menu.icount) {
              menu.size = menu.size * 2;
              menu.items = (nh_menuitem *)realloc(menu.items,lVar9 * 0x218);
            }
            pnVar1 = menu.items + menu.icount;
            pnVar1->id = 0;
            pnVar1->role = MI_HEADING;
            pnVar1->accel = '\0';
            pnVar1->group_accel = '\0';
            pnVar1->selected = '\0';
            pcVar4 = let_to_name(let,'\0');
            strcpy(pnVar1->caption,pcVar4);
            menu.icount = menu.icount + 1;
          }
          pcVar4 = "*";
          if ((objects[iVar10].field_0x10 & 8) == 0) {
            pcVar4 = " ";
          }
          pcVar5 = obj_typename(iVar10);
          sprintf(buf,"%s %s",pcVar4,pcVar5);
          lVar9 = (long)menu.size;
          if (menu.size <= menu.icount) {
            menu.size = menu.size * 2;
            menu.items = (nh_menuitem *)realloc(menu.items,lVar9 * 0x218);
          }
          iVar6 = iVar6 + 1;
          pnVar1 = menu.items + menu.icount;
          pnVar1->id = 0;
          pnVar1->role = MI_TEXT;
          pnVar1->accel = '\0';
          pnVar1->group_accel = '\0';
          pnVar1->selected = '\0';
          strcpy(pnVar1->caption,buf);
          menu.icount = menu.icount + 1;
          cVar3 = let;
        }
      }
      lVar7 = lVar7 + 1;
    }
    __dest = __dest + 1;
  } while( true );
}

Assistant:

int dodiscovered(void)
{
    int i, dis;
    int	ct = 0;
    char *s, oclass, prev_class, classes[MAXOCLASSES];
    struct menulist menu;
    char buf[BUFSZ];

    init_menulist(&menu);
    add_menutext(&menu, "Discoveries");
    add_menutext(&menu, "");

    /* gather "unique objects" into a pseudo-class; note that they'll
       also be displayed individually within their regular class */
    for (i = dis = 0; i < SIZE(uniq_objs); i++)
	if (objects[uniq_objs[i]].oc_name_known) {
	    if (!dis++)
		add_menuheading(&menu, "Unique Items");
	    sprintf(buf, "  %s", OBJ_NAME(objects[uniq_objs[i]]));
	    add_menutext(&menu, buf);
	    ++ct;
	}
    /* display any known artifacts as another pseudo-class */
    ct += disp_artifact_discoveries(&menu);

    /* several classes are omitted from packorder; one is of interest here */
    strcpy(classes, flags.inv_order);
    if (!strchr(classes, VENOM_CLASS)) {
	s = eos(classes);
	*s++ = VENOM_CLASS;
	*s = '\0';
    }

    for (s = classes; *s; s++) {
	oclass = *s;
	prev_class = oclass + 1;	/* forced different from oclass */
	for (i = bases[(int)oclass];
	     i < NUM_OBJECTS && objects[i].oc_class == oclass; i++) {
	    if ((dis = disco[i]) && interesting_to_discover(dis)) {
		ct++;
		if (oclass != prev_class) {
		    add_menuheading(&menu, let_to_name(oclass, FALSE));
		    prev_class = oclass;
		}
		sprintf(buf, "%s %s",(objects[dis].oc_pre_discovered ? "*" : " "),
				obj_typename(dis));
		add_menutext(&menu, buf);
	    }
	}
    }
    if (ct == 0) {
	pline("You haven't discovered anything yet...");
    } else
	display_menu(menu.items, menu.icount, NULL, PICK_NONE, NULL);
    free(menu.items);

    return 0;
}